

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

int item_number(Fl_Menu_Item *m,char *i)

{
  int iVar1;
  
  if (i != (char *)0x0 && m != (Fl_Menu_Item *)0x0) {
    if ((*i == 'F') && (i[1] == 'L')) {
      i = i + (ulong)(i[2] == '_') * 3;
    }
    for (; m->text != (char *)0x0; m = m + 1) {
      iVar1 = strcmp(m->text,i);
      if (iVar1 == 0) {
        return *(int *)&m->user_data_;
      }
    }
  }
  iVar1 = atoi(i);
  return iVar1;
}

Assistant:

int item_number(Fl_Menu_Item* m, const char* i) {
  if (m && i) {
    if (i[0]=='F' && i[1]=='L' && i[2]=='_') i += 3;
    while (m->label()) {
      if (!strcmp(m->label(), i)) return int(m->argument());
      m++;
    }
  }
  return atoi(i);
}